

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_paramSwitch_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  ZSTD_cwksp_alloc_phase_e ZVar1;
  bool bVar2;
  ZSTD_strategy ZVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  U32 *pUVar9;
  ulong uVar10;
  uint *puVar11;
  ZSTD_match_t *pZVar12;
  ZSTD_optimal_t *pZVar13;
  byte bVar14;
  U32 UVar15;
  uint uVar16;
  void *pvVar17;
  ulong uVar18;
  long lVar19;
  size_t __n;
  BYTE *pBVar20;
  
  if (((forWho == ZSTD_resetTarget_CDict) && (ms->dedicatedDictSearch != 0)) ||
     ((cParams->strategy != ZSTD_fast &&
      (useRowMatchFinder != ZSTD_ps_enable || 2 < cParams->strategy - ZSTD_greedy)))) {
    lVar19 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  else {
    lVar19 = 0;
  }
  bVar14 = (byte)cParams->hashLog;
  __n = 1L << (bVar14 & 0x3f);
  uVar8 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (uVar8 = 0, cParams->minMatch == 3)) {
    uVar8 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar8 = cParams->windowLog;
    }
  }
  if (forceResetIndex == ZSTDirp_reset) {
    (ms->window).nextSrc = (BYTE *)0x0;
    (ms->window).base = (BYTE *)0x0;
    (ms->window).dictBase = (BYTE *)0x0;
    (ms->window).dictLimit = 0;
    (ms->window).lowLimit = 0;
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    (ms->window).base = " ";
    (ms->window).dictBase = " ";
    (ms->window).dictLimit = 2;
    (ms->window).lowLimit = 2;
    (ms->window).nextSrc = (BYTE *)"id-ce-certificatePolicies";
    (ms->window).nbOverflowCorrections = 0;
    ws->tableValidEnd = ws->objectEnd;
  }
  ms->hashLog3 = uVar8;
  ms->lazySkipping = 0;
  UVar15 = *(int *)&(ms->window).nextSrc - *(int *)&(ms->window).base;
  (ms->window).lowLimit = UVar15;
  (ms->window).dictLimit = UVar15;
  ms->nextToUpdate = UVar15;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  pvVar17 = ws->objectEnd;
  ws->tableEnd = pvVar17;
  if ((int)ws->phase < 1) {
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
      goto LAB_018e40e0;
    }
LAB_018e40f1:
    pUVar9 = (U32 *)0x0;
  }
  else {
LAB_018e40e0:
    pUVar9 = (U32 *)ws->tableEnd;
    pvVar17 = (void *)((4L << (bVar14 & 0x3f)) + (long)pUVar9);
    if (ws->allocStart < pvVar17) {
      ws->allocFailed = '\x01';
      goto LAB_018e40f1;
    }
    ws->tableEnd = pvVar17;
  }
  ms->hashTable = pUVar9;
  if ((int)ws->phase < 1) {
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
      goto LAB_018e4141;
    }
LAB_018e4152:
    pUVar9 = (U32 *)0x0;
  }
  else {
LAB_018e4141:
    pUVar9 = (U32 *)ws->tableEnd;
    if (ws->allocStart < (void *)(lVar19 + (long)pUVar9)) {
      ws->allocFailed = '\x01';
      goto LAB_018e4152;
    }
    ws->tableEnd = (void *)(lVar19 + (long)pUVar9);
  }
  ms->chainTable = pUVar9;
  lVar19 = 4L << ((byte)uVar8 & 0x3f);
  if (uVar8 == 0) {
    lVar19 = 0;
  }
  if ((int)ws->phase < 1) {
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
      goto LAB_018e41ad;
    }
LAB_018e41be:
    pUVar9 = (U32 *)0x0;
  }
  else {
LAB_018e41ad:
    pUVar9 = (U32 *)ws->tableEnd;
    if (ws->allocStart < (void *)(lVar19 + (long)pUVar9)) {
      ws->allocFailed = '\x01';
      goto LAB_018e41be;
    }
    ws->tableEnd = (void *)(lVar19 + (long)pUVar9);
  }
  ms->hashTable3 = pUVar9;
  if (ws->allocFailed != '\0') {
    return 0xffffffffffffffc0;
  }
  if (crp != ZSTDcrp_leaveDirty) {
    pvVar17 = ws->tableValidEnd;
    if (pvVar17 < ws->tableEnd) {
      switchD_01306cb1::default(pvVar17,0,(long)ws->tableEnd - (long)pvVar17);
    }
    if (ws->tableValidEnd < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
  }
  if ((useRowMatchFinder == ZSTD_ps_enable) && (0xfffffffc < cParams->strategy - ZSTD_btlazy2)) {
    uVar10 = __n + 0x3f & 0xffffffffffffffc0;
    ZVar1 = ws->phase;
    if (forWho == ZSTD_resetTarget_CCtx) {
      if ((int)ZVar1 < 1) {
        pvVar17 = ws->objectEnd;
        ws->tableValidEnd = pvVar17;
        ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
        uVar18 = (ulong)(-(int)pvVar17 & 0x3f);
        pvVar17 = (void *)((long)pvVar17 + uVar18);
        bVar2 = true;
        if (pvVar17 <= ws->workspaceEnd) {
          ws->objectEnd = pvVar17;
          ws->tableEnd = pvVar17;
          if (uVar18 != 0) {
            ws->tableValidEnd = pvVar17;
          }
          ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
          goto LAB_018e4275;
        }
      }
      else {
LAB_018e4275:
        bVar2 = false;
      }
      if (uVar10 == 0 || bVar2) {
LAB_018e4292:
        pBVar20 = (BYTE *)0x0;
      }
      else {
        pBVar20 = (BYTE *)((long)ws->allocStart - uVar10);
        if (pBVar20 < ws->tableEnd) {
          ws->allocFailed = '\x01';
          goto LAB_018e4292;
        }
        if (pBVar20 < ws->tableValidEnd) {
          ws->tableValidEnd = pBVar20;
        }
        ws->allocStart = pBVar20;
      }
      if ((pBVar20 != (BYTE *)0x0) && (pBVar20 < ws->initOnceStart)) {
        uVar18 = (long)ws->initOnceStart - (long)pBVar20;
        if (uVar10 <= uVar18) {
          uVar18 = uVar10;
        }
        switchD_01306cb1::default(pBVar20,0,uVar18);
        ws->initOnceStart = pBVar20;
      }
      ms->tagTable = pBVar20;
      uVar10 = ms->hashSalt;
      uVar10 = ((uVar10 << 0x28 | uVar10 >> 0x18) ^ (uVar10 << 0xf | uVar10 >> 0x31) ^ uVar10) *
               -0x604de39ae16720db;
      uVar18 = (ulong)ms->hashSaltEntropy;
      uVar18 = ((uVar18 << 0x28 | (ulong)(ms->hashSaltEntropy >> 0x18)) ^ uVar18 << 0xf ^ uVar18) *
               -0x604de39ae16720db;
      uVar10 = ((uVar18 >> 0x23) + 4 ^ uVar18) * -0x604de39ae16720db ^
               ((uVar10 >> 0x23) + 8 ^ uVar10) * -0x604de39ae16720db;
      ms->hashSalt = uVar10 >> 0x1c ^ uVar10;
    }
    else {
      if ((int)ZVar1 < 2) {
        if (ZVar1 == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018e42d7:
          ws->phase = ZSTD_cwksp_alloc_aligned;
          goto LAB_018e42de;
        }
        pvVar17 = ws->objectEnd;
        ws->tableValidEnd = pvVar17;
        ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
        uVar18 = (ulong)(-(int)pvVar17 & 0x3f);
        pvVar17 = (void *)((long)pvVar17 + uVar18);
        bVar2 = true;
        if (pvVar17 <= ws->workspaceEnd) {
          ws->objectEnd = pvVar17;
          ws->tableEnd = pvVar17;
          if (uVar18 != 0) {
            ws->tableValidEnd = pvVar17;
          }
          goto LAB_018e42d7;
        }
      }
      else {
LAB_018e42de:
        bVar2 = false;
      }
      if (uVar10 == 0 || bVar2) {
LAB_018e42ff:
        pBVar20 = (BYTE *)0x0;
      }
      else {
        pBVar20 = (BYTE *)((long)ws->allocStart - uVar10);
        if (pBVar20 < ws->tableEnd) {
          ws->allocFailed = '\x01';
          goto LAB_018e42ff;
        }
        if (pBVar20 < ws->tableValidEnd) {
          ws->tableValidEnd = pBVar20;
        }
        ws->allocStart = pBVar20;
      }
      ms->tagTable = pBVar20;
      switchD_01306cb1::default(pBVar20,0,__n);
      ms->hashSalt = 0;
    }
    uVar8 = 6;
    if (cParams->searchLog < 6) {
      uVar8 = cParams->searchLog;
    }
    uVar16 = 4;
    if (4 < uVar8) {
      uVar16 = uVar8;
    }
    ms->rowHashLog = cParams->hashLog - uVar16;
  }
  if ((forWho != ZSTD_resetTarget_CCtx) || ((int)cParams->strategy < 7)) goto LAB_018e46c6;
  if ((int)ws->phase < 2) {
    if (ws->phase == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018e4450:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_018e4457;
    }
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      goto LAB_018e4450;
    }
LAB_018e446c:
    puVar11 = (uint *)0x0;
  }
  else {
LAB_018e4457:
    puVar11 = (uint *)((long)ws->allocStart - 0x400);
    if (puVar11 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_018e446c;
    }
    if (puVar11 < ws->tableValidEnd) {
      ws->tableValidEnd = puVar11;
    }
    ws->allocStart = puVar11;
  }
  (ms->opt).litFreq = puVar11;
  if ((int)ws->phase < 2) {
    if (ws->phase == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018e44c4:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_018e44cb;
    }
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      goto LAB_018e44c4;
    }
LAB_018e44e0:
    puVar11 = (uint *)0x0;
  }
  else {
LAB_018e44cb:
    puVar11 = (uint *)((long)ws->allocStart - 0xc0);
    if (puVar11 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_018e44e0;
    }
    if (puVar11 < ws->tableValidEnd) {
      ws->tableValidEnd = puVar11;
    }
    ws->allocStart = puVar11;
  }
  (ms->opt).litLengthFreq = puVar11;
  if ((int)ws->phase < 2) {
    if (ws->phase == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018e4538:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_018e453f;
    }
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      goto LAB_018e4538;
    }
LAB_018e4554:
    puVar11 = (uint *)0x0;
  }
  else {
LAB_018e453f:
    puVar11 = (uint *)((long)ws->allocStart - 0x100);
    if (puVar11 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_018e4554;
    }
    if (puVar11 < ws->tableValidEnd) {
      ws->tableValidEnd = puVar11;
    }
    ws->allocStart = puVar11;
  }
  (ms->opt).matchLengthFreq = puVar11;
  if ((int)ws->phase < 2) {
    if (ws->phase == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018e45ac:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_018e45b3;
    }
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      goto LAB_018e45ac;
    }
LAB_018e45c5:
    puVar11 = (uint *)0x0;
  }
  else {
LAB_018e45b3:
    puVar11 = (uint *)((long)ws->allocStart - 0x80);
    if (puVar11 < ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_018e45c5;
    }
    if (puVar11 < ws->tableValidEnd) {
      ws->tableValidEnd = puVar11;
    }
    ws->allocStart = puVar11;
  }
  (ms->opt).offCodeFreq = puVar11;
  if ((int)ws->phase < 2) {
    if (ws->phase == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018e461d:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_018e4624;
    }
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      goto LAB_018e461d;
    }
LAB_018e4639:
    pZVar12 = (ZSTD_match_t *)0x0;
  }
  else {
LAB_018e4624:
    pZVar12 = (ZSTD_match_t *)((long)ws->allocStart - 0x8040);
    if (pZVar12 < (ZSTD_match_t *)ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_018e4639;
    }
    if (pZVar12 < (ZSTD_match_t *)ws->tableValidEnd) {
      ws->tableValidEnd = pZVar12;
    }
    ws->allocStart = pZVar12;
  }
  (ms->opt).matchTable = pZVar12;
  if ((int)ws->phase < 2) {
    if (ws->phase == ZSTD_cwksp_alloc_aligned_init_once) {
LAB_018e4691:
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_018e4698;
    }
    pvVar17 = ws->objectEnd;
    ws->tableValidEnd = pvVar17;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar10 = (ulong)(-(int)pvVar17 & 0x3f);
    pvVar17 = (void *)((long)pvVar17 + uVar10);
    if (pvVar17 <= ws->workspaceEnd) {
      ws->objectEnd = pvVar17;
      ws->tableEnd = pvVar17;
      if (uVar10 != 0) {
        ws->tableValidEnd = pvVar17;
      }
      goto LAB_018e4691;
    }
LAB_018e46ad:
    pZVar13 = (ZSTD_optimal_t *)0x0;
  }
  else {
LAB_018e4698:
    pZVar13 = (ZSTD_optimal_t *)((long)ws->allocStart - 0x1c080);
    if (pZVar13 < (ZSTD_optimal_t *)ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_018e46ad;
    }
    if (pZVar13 < (ZSTD_optimal_t *)ws->tableValidEnd) {
      ws->tableValidEnd = pZVar13;
    }
    ws->allocStart = pZVar13;
  }
  (ms->opt).priceTable = pZVar13;
LAB_018e46c6:
  uVar4 = cParams->windowLog;
  uVar5 = cParams->chainLog;
  uVar6 = cParams->hashLog;
  uVar7 = cParams->searchLog;
  uVar8 = cParams->minMatch;
  uVar16 = cParams->targetLength;
  ZVar3 = cParams->strategy;
  (ms->cParams).searchLog = cParams->searchLog;
  (ms->cParams).minMatch = uVar8;
  (ms->cParams).targetLength = uVar16;
  (ms->cParams).strategy = ZVar3;
  (ms->cParams).windowLog = uVar4;
  (ms->cParams).chainLog = uVar5;
  (ms->cParams).hashLog = uVar6;
  (ms->cParams).searchLog = uVar7;
  return (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_paramSwitch_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_ps_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;
    ms->lazySkipping = 0;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        /* Row match finder needs an additional table of hashes ("tags") */
        size_t const tagTableSize = hSize;
        /* We want to generate a new salt in case we reset a Cctx, but we always want to use
         * 0 when we reset a Cdict */
        if(forWho == ZSTD_resetTarget_CCtx) {
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned_init_once(ws, tagTableSize);
            ZSTD_advanceHashSalt(ms);
        } else {
            /* When we are not salting we want to always memset the memory */
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            ZSTD_memset(ms->tagTable, 0, tagTableSize);
            ms->hashSalt = 0;
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = BOUNDED(4, cParams->searchLog, 6);
            assert(cParams->hashLog >= rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, ZSTD_OPT_SIZE * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, ZSTD_OPT_SIZE * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}